

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

void __thiscall QFactoryLoader::~QFactoryLoader(QFactoryLoader *this)

{
  QList<QObject_*(*)()> *this_00;
  long lVar1;
  Type *pTVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  QObject *pQVar6;
  QMutexLocker<QRecursiveMutex> *this_01;
  QLibraryPrivate *this_02;
  qsizetype i;
  ulong __n;
  long in_FS_OFFSET;
  QFactoryLoader *local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>::guard
                 ._q_value.super___atomic_base<signed_char>._M_i) {
    this_01 = (QMutexLocker<QRecursiveMutex> *)local_38;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
             ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                           *)this);
    QMutexLocker<QRecursiveMutex>::QMutexLocker(this_01,&pTVar2->mutex);
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
             ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                           *)this_01);
    local_40 = this;
    QtPrivate::sequential_erase_one<QList<QFactoryLoader*>,QFactoryLoader*>
              (&pTVar2->loaders,&local_40);
    QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38);
  }
  for (__n = 0; __n < (ulong)(this->d).loadedLibraries.d.size; __n = __n + 1) {
    if ((this->d).loadedLibraries.d.ptr[__n] == true) {
      pvVar3 = std::
               vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
               ::at(&(this->d).libraries,__n);
      this_02 = (pvVar3->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>._M_t
                .super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl;
      lVar1 = (long)(this_02->inst).wp.d;
      if (((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) &&
         (pQVar6 = (this_02->inst).wp.value, pQVar6 != (QObject *)0x0)) {
        (*pQVar6->_vptr_QObject[4])(pQVar6);
        this_02 = (pvVar3->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                  super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl;
      }
      QLibraryPrivate::unload(this_02,UnloadSys);
    }
  }
  this_00 = &(this->d).usedStaticInstances;
  iVar4 = QList<QObject_*(*)()>::begin(this_00);
  iVar5 = QList<QObject_*(*)()>::end(this_00);
  for (; iVar4.i != iVar5.i; iVar4.i = iVar4.i + 1) {
    if (*iVar4.i != (_func_QObject_ptr *)0x0) {
      pQVar6 = (**iVar4.i)();
      if (pQVar6 != (QObject *)0x0) {
        (*pQVar6->_vptr_QObject[4])(pQVar6);
      }
    }
  }
  Private::~Private(&this->d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFactoryLoader::~QFactoryLoader()
{
    if (!qt_factoryloader_global.isDestroyed()) {
        QMutexLocker locker(&qt_factoryloader_global->mutex);
        qt_factoryloader_global->loaders.removeOne(this);
    }

#if QT_CONFIG(library)
    for (qsizetype i = 0; i < d->loadedLibraries.size(); ++i) {
        if (d->loadedLibraries.at(i)) {
            auto &plugin = d->libraries.at(i);
            delete plugin->inst.data();
            plugin->unload();
        }
    }
#endif

    for (QtPluginInstanceFunction staticInstance : d->usedStaticInstances) {
        if (staticInstance)
            delete staticInstance();
    }
}